

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

QTreeWidgetItem * __thiscall
QList<QTreeWidgetItem_*>::takeAt(QList<QTreeWidgetItem_*> *this,qsizetype i)

{
  QTreeWidgetItem *pQVar1;
  Data *pDVar2;
  pointer ppQVar3;
  
  ppQVar3 = data(this);
  pQVar1 = ppQVar3[i];
  pDVar2 = (this->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QTreeWidgetItem_*>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,(QArrayDataPointer<QTreeWidgetItem_*> *)0x0);
  }
  QtPrivate::QPodArrayOps<QTreeWidgetItem_*>::erase
            ((QPodArrayOps<QTreeWidgetItem_*> *)this,(this->d).ptr + i,1);
  return pQVar1;
}

Assistant:

T takeAt(qsizetype i) { T t = std::move((*this)[i]); remove(i); return t; }